

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readParameters.hpp
# Opt level: O3

ResonanceParameters * __thiscall
njoy::ENDFtk::section::Type<32,151>::Isotope::
readParameters<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (ResonanceParameters *__return_storage_ptr__,Isotope *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int LRU,int LRF,int LFW)

{
  undefined8 *puVar1;
  char *pcVar2;
  int MAT_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  start;
  ControlRecord cont;
  undefined1 local_188 [24];
  long lStack_170;
  undefined1 local_168 [40];
  vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
  local_140;
  undefined8 uStack_128;
  ulong local_120;
  vector<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
  local_118;
  vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
  local_100;
  pointer local_e8;
  pointer local_e0;
  pointer local_d8;
  pointer local_c8;
  long local_b8;
  pointer local_b0;
  pointer local_a0;
  pointer local_98;
  pointer local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  ControlRecord local_60;
  
  MAT_00 = (int)lineNumber;
  local_68._M_current = *(char **)this;
  ControlRecord::ControlRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_60,&local_68,begin,(long *)end,MAT_00,MAT,MF);
  if (MT == 2) {
    UnresolvedRelativeCovariances::
    UnresolvedRelativeCovariances<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((UnresolvedRelativeCovariances *)local_188,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      ._M_u = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ._M_u + 8) = local_188._8_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ._M_u + 0x10) = local_188._16_8_;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     ._M_u + 0x18) = lStack_170;
    ((_Tuple_impl<5UL,_long> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x20))->super__Head_base<5UL,_long,_false> =
         (_Head_base<5UL,_long,_false>)local_168._0_8_;
    local_168._0_8_ = (_Head_base<5UL,_long,_false>)0x0;
    local_188._16_8_ = 0;
    lStack_170 = 0;
    ((_Head_base<4UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x28))->_M_head_impl = local_168._8_8_;
    ((_Head_base<3UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x30))->_M_head_impl = local_168._16_8_;
    ((_Head_base<2UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x38))->_M_head_impl = local_168._24_8_;
    ((_Head_base<1UL,_double,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x40))->_M_head_impl = (double)local_168._32_8_;
    ((_Head_base<0UL,_double,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x48))->_M_head_impl =
         (double)local_140.
                 super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ._M_u + 0x50) =
         local_140.
         super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ._M_u + 0x58) =
         local_140.
         super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ._M_u + 0x60) = uStack_128;
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                      ).
                      super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                      .
                      super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                      .
                      super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                      .
                      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                      .
                      super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                      ._M_u + 0x68) = local_120;
    local_120 = 0;
    local_140.
    super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uStack_128 = (pointer)0x0;
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    ._M_index = '\n';
    std::
    vector<njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances::LValue,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances::LValue>_>
    ::~vector((vector<njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances::LValue,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances::LValue>_>
               *)(local_188 + 0x10));
    return __return_storage_ptr__;
  }
  if (MT != 1) {
    tools::Log::error<char_const*>("Encountered illegal LRU value");
    tools::Log::info<char_const*>("LRU should be 1 (resolved) or 2 (unresolved)");
    pcVar2 = "LRU value: {}";
    local_60.
    super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
    .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
    super__Head_base<3UL,_long,_false>._M_head_impl._0_4_ = MT;
LAB_00174567:
    tools::Log::info<char_const*,int>
              (pcVar2,(int)local_60.
                           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<2UL,_long,_long,_long,_long>.
                           super__Tuple_impl<3UL,_long,_long,_long>.
                           super__Head_base<3UL,_long,_false>._M_head_impl);
LAB_0017456c:
    pcVar2 = end->_M_current;
LAB_00174574:
    tools::Log::info<char_const*,long>("Line number: {}",(long)pcVar2);
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = getenv;
    __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
  }
  if ((int)local_60.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Head_base<3UL,_long,_false>._M_head_impl == 2) {
    switch(LRU) {
    case 1:
      CompactSingleLevelBreitWigner::
      CompactSingleLevelBreitWigner<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((CompactSingleLevelBreitWigner *)local_188,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,MAT_00,MAT,MF);
      std::__detail::__variant::
      _Uninitialized<njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,false>::
      _Uninitialized<njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner>
                ((_Uninitialized<njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_false>
                  *)__return_storage_ptr__,(CompactSingleLevelBreitWigner *)local_188);
      (__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      ._M_index = '\x06';
      break;
    case 2:
      CompactMultiLevelBreitWigner::
      CompactMultiLevelBreitWigner<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((CompactMultiLevelBreitWigner *)local_188,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,MAT_00,MAT,MF);
      std::__detail::__variant::
      _Uninitialized<njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,false>::
      _Uninitialized<njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner>
                ((_Uninitialized<njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_false>
                  *)__return_storage_ptr__,(CompactMultiLevelBreitWigner *)local_188);
      (__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      ._M_index = '\a';
      break;
    case 3:
      CompactReichMoore::CompactReichMoore<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((CompactReichMoore *)local_188,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,MAT_00,MAT,MF);
      std::__detail::__variant::
      _Uninitialized<njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,false>::
      _Uninitialized<njoy::ENDFtk::section::Type<32,151>::CompactReichMoore>
                ((_Uninitialized<njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,false> *)
                 __return_storage_ptr__,(CompactReichMoore *)local_188);
      (__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      ._M_index = '\b';
      if (local_98 != (pointer)0x0) {
        operator_delete(local_98,(long)local_88 - (long)local_98);
      }
      if (local_b0 != (pointer)0x0) {
        operator_delete(local_b0,(long)local_a0 - (long)local_b0);
      }
      if (local_c8 != (pointer)0x0) {
        operator_delete(local_c8,local_b8 - (long)local_c8);
      }
      if (local_e8 != (pointer)0x0) {
        operator_delete(local_e8,(long)local_d8 - (long)local_e8);
      }
      if (local_120._0_1_ != true) {
        return __return_storage_ptr__;
      }
      goto LAB_0017430e;
    default:
      tools::Log::error<char_const*>("Encountered illegal LRF value for LCOMP = 2");
      pcVar2 = "LRF is equal to 1, 2, 3 or 7";
LAB_00174558:
      tools::Log::info<char_const*>(pcVar2);
      pcVar2 = "LRF value: {}";
      local_60.
      super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
      .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
      super__Head_base<3UL,_long,_false>._M_head_impl._0_4_ = LRU;
      goto LAB_00174567;
    case 7:
      CompactRMatrixLimited::
      CompactRMatrixLimited<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((CompactRMatrixLimited *)local_188,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,MAT_00,MAT,MF);
      std::__detail::__variant::
      _Uninitialized<njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,false>::
      _Uninitialized<njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited>
                ((_Uninitialized<njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,false> *
                 )__return_storage_ptr__,
                 (CompactCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited>
                  *)local_188);
      (__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      ._M_index = '\t';
      Type<32,_151>::
      CompactCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited>
      ::~CompactCovarianceBase
                ((CompactCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited>
                  *)local_188);
      return __return_storage_ptr__;
    }
    if (local_d8 != (pointer)0x0) {
      operator_delete(local_d8,(long)local_c8 - (long)local_d8);
    }
    if (local_100.
        super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(local_100.
                      super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)local_e0 -
                      (long)local_100.
                            super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (local_118.
        super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(local_118.
                      super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)local_100.
                            super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_118.
                            super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if ((pointer)uStack_128 == (pointer)0x0) {
      return __return_storage_ptr__;
    }
    goto LAB_00174484;
  }
  if ((int)local_60.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Head_base<3UL,_long,_false>._M_head_impl != 1) {
    if ((int)local_60.
             super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
             .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>
             .super__Head_base<3UL,_long,_false>._M_head_impl == 0) {
      if (LRU == 2) {
        LimitedMultiLevelBreitWigner::
        LimitedMultiLevelBreitWigner<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((LimitedMultiLevelBreitWigner *)local_188,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this,begin,(long *)end,MAT_00,MAT,MF);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 ).
                 super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 ._M_u + 0x10) = local_188._16_8_;
        *(long *)((long)&(__return_storage_ptr__->
                         super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                         ).
                         super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                         .
                         super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                         .
                         super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                         .
                         super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                         .
                         super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                         ._M_u + 0x18) = lStack_170;
        *(undefined8 *)
         &(__return_storage_ptr__->
          super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
          ).
          super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
          .
          super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
          .
          super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
          .
          super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
          .
          super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
          ._M_u = local_188._0_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 ).
                 super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 ._M_u + 8) = local_188._8_8_;
        ((_Tuple_impl<5UL,_long> *)
        ((long)&(__return_storage_ptr__->
                super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                ).
                super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                ._M_u + 0x20))->super__Head_base<5UL,_long,_false> =
             (_Head_base<5UL,_long,_false>)local_168._0_8_;
        ((_Head_base<4UL,_long,_false> *)
        ((long)&(__return_storage_ptr__->
                super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                ).
                super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                ._M_u + 0x28))->_M_head_impl = local_168._8_8_;
        ((_Head_base<3UL,_long,_false> *)
        ((long)&(__return_storage_ptr__->
                super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                ).
                super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                ._M_u + 0x30))->_M_head_impl = local_168._16_8_;
        (__return_storage_ptr__->
        super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
        ).
        super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
        .
        super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
        .
        super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
        .
        super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
        .
        super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
        ._M_index = '\x01';
LAB_001741b3:
        local_168._16_8_ = 0;
        local_168._8_8_ = 0;
        local_168._0_8_ = 0;
        std::
        vector<njoy::ENDFtk::section::Type<32,_151>::LimitedBreitWignerLValue,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::LimitedBreitWignerLValue>_>
        ::~vector((vector<njoy::ENDFtk::section::Type<32,_151>::LimitedBreitWignerLValue,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::LimitedBreitWignerLValue>_>
                   *)local_168);
        return __return_storage_ptr__;
      }
      if (LRU == 1) {
        LimitedSingleLevelBreitWigner::
        LimitedSingleLevelBreitWigner<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((LimitedSingleLevelBreitWigner *)local_188,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this,begin,(long *)end,MAT_00,MAT,MF);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 ).
                 super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 ._M_u + 0x10) = local_188._16_8_;
        *(long *)((long)&(__return_storage_ptr__->
                         super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                         ).
                         super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                         .
                         super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                         .
                         super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                         .
                         super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                         .
                         super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                         ._M_u + 0x18) = lStack_170;
        *(undefined8 *)
         &(__return_storage_ptr__->
          super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
          ).
          super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
          .
          super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
          .
          super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
          .
          super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
          .
          super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
          ._M_u = local_188._0_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 ).
                 super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 .
                 super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                 ._M_u + 8) = local_188._8_8_;
        ((_Tuple_impl<5UL,_long> *)
        ((long)&(__return_storage_ptr__->
                super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                ).
                super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                ._M_u + 0x20))->super__Head_base<5UL,_long,_false> =
             (_Head_base<5UL,_long,_false>)local_168._0_8_;
        ((_Head_base<4UL,_long,_false> *)
        ((long)&(__return_storage_ptr__->
                super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                ).
                super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                ._M_u + 0x28))->_M_head_impl = local_168._8_8_;
        ((_Head_base<3UL,_long,_false> *)
        ((long)&(__return_storage_ptr__->
                super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                ).
                super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                .
                super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                ._M_u + 0x30))->_M_head_impl = local_168._16_8_;
        (__return_storage_ptr__->
        super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
        ).
        super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
        .
        super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
        .
        super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
        .
        super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
        .
        super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
        ._M_index = '\0';
        goto LAB_001741b3;
      }
      tools::Log::error<char_const*>("Encountered illegal LRF value for LCOMP = 0");
      tools::Log::info<char_const*>("LRF is equal to 1 or 2");
      tools::Log::info<char_const*,int>("LRF value: {}",LRU);
      pcVar2 = end->_M_current;
      goto LAB_00174574;
    }
    tools::Log::error<char_const*>("Encountered illegal LCOMP value");
    tools::Log::info<char_const*>("LCOMP is either 0 (limited), 1 (general) or 2 (compact)");
    pcVar2 = "LCOMP value: {}";
    goto LAB_00174567;
  }
  switch(LRU) {
  case 1:
    GeneralSingleLevelBreitWigner::
    GeneralSingleLevelBreitWigner<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((GeneralSingleLevelBreitWigner *)local_188,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    ((_Tuple_impl<5UL,_long> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x20))->super__Head_base<5UL,_long,_false> =
         (_Head_base<5UL,_long,_false>)local_168._0_8_;
    ((_Head_base<4UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x28))->_M_head_impl = local_168._8_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ._M_u + 0x10) = local_188._16_8_;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     ._M_u + 0x18) = lStack_170;
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      ._M_u = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ._M_u + 8) = local_188._8_8_;
    ((_Head_base<3UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x30))->_M_head_impl = local_168._16_8_;
    ((_Head_base<2UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x38))->_M_head_impl = local_168._24_8_;
    ((_Head_base<1UL,_double,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x40))->_M_head_impl = (double)local_168._32_8_;
    ((_Head_base<0UL,_double,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x48))->_M_head_impl =
         (double)local_140.
                 super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ._M_u + 0x50) =
         local_140.
         super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ._M_u + 0x58) =
         local_140.
         super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    ._M_index = '\x02';
    goto LAB_001743a3;
  case 2:
    GeneralMultiLevelBreitWigner::
    GeneralMultiLevelBreitWigner<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((GeneralMultiLevelBreitWigner *)local_188,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    ((_Tuple_impl<5UL,_long> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x20))->super__Head_base<5UL,_long,_false> =
         (_Head_base<5UL,_long,_false>)local_168._0_8_;
    ((_Head_base<4UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x28))->_M_head_impl = local_168._8_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ._M_u + 0x10) = local_188._16_8_;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     ._M_u + 0x18) = lStack_170;
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
      ._M_u = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ._M_u + 8) = local_188._8_8_;
    ((_Head_base<3UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x30))->_M_head_impl = local_168._16_8_;
    ((_Head_base<2UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x38))->_M_head_impl = local_168._24_8_;
    ((_Head_base<1UL,_double,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x40))->_M_head_impl = (double)local_168._32_8_;
    ((_Head_base<0UL,_double,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ).
            super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            .
            super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
            ._M_u + 0x48))->_M_head_impl =
         (double)local_140.
                 super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ._M_u + 0x50) =
         local_140.
         super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
             ._M_u + 0x58) =
         local_140.
         super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    ._M_index = '\x03';
LAB_001743a3:
    local_140.
    super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_140.
    super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_140.
    super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168._32_8_ = 0.0;
    local_168._24_8_ = 0;
    local_168._16_8_ = 0;
    std::
    vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
    ::~vector(&local_140);
    std::
    vector<njoy::ENDFtk::section::Type<32,_151>::ShortRangeBreitWignerBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeBreitWignerBlock>_>
    ::~vector((vector<njoy::ENDFtk::section::Type<32,_151>::ShortRangeBreitWignerBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeBreitWignerBlock>_>
               *)(local_168 + 0x10));
    return __return_storage_ptr__;
  case 3:
    GeneralReichMoore::GeneralReichMoore<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((GeneralReichMoore *)local_188,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::__detail::__variant::
    _Uninitialized<njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,false>::
    _Uninitialized<njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore>
              ((_Uninitialized<njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,false> *)
               __return_storage_ptr__,(GeneralReichMoore *)local_188);
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    ._M_index = '\x04';
    std::
    vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
    ::~vector(&local_100);
    std::
    vector<njoy::ENDFtk::section::Type<32,_151>::ShortRangeReichMooreBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeReichMooreBlock>_>
    ::~vector((vector<njoy::ENDFtk::section::Type<32,_151>::ShortRangeReichMooreBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeReichMooreBlock>_>
               *)&local_118);
    break;
  default:
    tools::Log::error<char_const*>("Encountered illegal LRF value for LCOMP = 1");
    if (LRU != 4) {
      pcVar2 = "LRF is equal to 1, 2, 3, 4 or 7";
      goto LAB_00174558;
    }
    tools::Log::info<char_const*>("LRF equal to 4 (Adler-Adler) is currently unsupported");
    goto LAB_0017456c;
  case 7:
    GeneralRMatrixLimited::
    GeneralRMatrixLimited<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((GeneralRMatrixLimited *)local_188,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::__detail::__variant::
    _Uninitialized<njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,false>::
    _Uninitialized<njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited>
              ((_Uninitialized<njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,false> *)
               __return_storage_ptr__,(GeneralRMatrixLimited *)local_188);
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
    ._M_index = '\x05';
    std::
    vector<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
    ::~vector(&local_100);
    std::
    vector<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
    ::~vector(&local_118);
  }
  if (local_120._0_1_ != true) {
    return __return_storage_ptr__;
  }
LAB_0017430e:
  local_120 = local_120 & 0xffffffffffffff00;
  local_118.
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)uStack_128;
  uStack_128 = local_140.
               super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  if ((pointer)local_140.
               super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
               ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
    return __return_storage_ptr__;
  }
LAB_00174484:
  operator_delete((void *)uStack_128,
                  (long)local_118.
                        super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
                        ._M_impl.super__Vector_impl_data._M_start - uStack_128);
  return __return_storage_ptr__;
}

Assistant:

static ResonanceRange::ResonanceParameters
readParameters( Iterator& begin,
                const Iterator& end,
                long& lineNumber,
                int MAT,
                int MF,
                int MT,
                int LRU,
                int LRF,
                int LFW ) {

  Iterator start = begin;
  long current = lineNumber;
  ControlRecord cont( start, end, lineNumber, MAT, MF, MT );

  switch ( LRU ) {

    // resolved resonances
    case 1 : {

      int LCOMP = cont.L2();
      switch ( LCOMP ) {

        case 0: {

          switch ( LRF ) {

            case 1 : return LimitedSingleLevelBreitWigner(
                                begin, end, lineNumber, MAT, MF, MT );
            case 2 : return LimitedMultiLevelBreitWigner(
                                begin, end, lineNumber, MAT, MF, MT );
            default : {

              Log::error( "Encountered illegal LRF value for LCOMP = 0" );
              Log::info( "LRF is equal to 1 or 2" );
              Log::info( "LRF value: {}", LRF );
              Log::info( "Line number: {}", lineNumber );
              throw std::exception();
            }
          }
        }
        case 1: {

          switch ( LRF ) {

            case 1 : return GeneralSingleLevelBreitWigner(
                                begin, end, lineNumber, MAT, MF, MT );
            case 2 : return GeneralMultiLevelBreitWigner(
                                begin, end, lineNumber, MAT, MF, MT );
            case 3 : return GeneralReichMoore(
                                begin, end, lineNumber, MAT, MF, MT );
            case 7 : return GeneralRMatrixLimited(
                                begin, end, lineNumber, MAT, MF, MT );
            default : {

              Log::error( "Encountered illegal LRF value for LCOMP = 1" );
              if ( LRF != 4 ) {

                Log::info( "LRF is equal to 1, 2, 3, 4 or 7" );
                Log::info( "LRF value: {}", LRF );
              }
              else {

                Log::info( "LRF equal to 4 (Adler-Adler) is currently unsupported" );
              }
              Log::info( "Line number: {}", lineNumber );
              throw std::exception();
            }
          }
        }
        case 2 : {

          switch ( LRF ) {

            case 1 : return CompactSingleLevelBreitWigner(
                                begin, end, lineNumber, MAT, MF, MT );
            case 2 : return CompactMultiLevelBreitWigner(
                                begin, end, lineNumber, MAT, MF, MT );
            case 3 : return CompactReichMoore(
                                begin, end, lineNumber, MAT, MF, MT );
            case 7 : return CompactRMatrixLimited(
                                begin, end, lineNumber, MAT, MF, MT );
            default : {

              Log::error( "Encountered illegal LRF value for LCOMP = 2" );
              Log::info( "LRF is equal to 1, 2, 3 or 7" );
              Log::info( "LRF value: {}", LRF );
              Log::info( "Line number: {}", lineNumber );
              throw std::exception();
            }
          }
        }
        default : {

          Log::error( "Encountered illegal LCOMP value" );
          Log::info( "LCOMP is either 0 (limited), 1 (general) or 2 (compact)" );
          Log::info( "LCOMP value: {}", LCOMP );
          Log::info( "Line number: {}", lineNumber );
          throw std::exception();
        }
      }
    }
    case 2: {

      return UnresolvedRelativeCovariances( begin, end, lineNumber, MAT, MF, MT );
    }
    default : {

      Log::error( "Encountered illegal LRU value" );
      Log::info( "LRU should be 1 (resolved) or 2 (unresolved)" );
      Log::info( "LRU value: {}", LRU );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception();
    }
  }
}